

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows_h.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  EitherFlag *local_9d0;
  EitherFlag *local_9b8;
  Completion *e;
  Help *anon_var_0;
  ParseError *e_1;
  EitherFlag local_968;
  iterator local_940;
  undefined1 local_938 [120];
  undefined1 local_8c0 [8];
  CompletionFlag completion;
  EitherFlag local_768;
  EitherFlag local_740;
  iterator local_718;
  undefined1 local_710 [127];
  allocator local_691;
  string local_690;
  allocator local_669;
  string local_668;
  undefined1 local_648 [8];
  HelpFlag help;
  string local_530;
  allocator local_4f9;
  string local_4f8;
  undefined1 local_4d8 [8];
  ArgumentParser parser;
  char **argv_local;
  int argc_local;
  
  parser.helpParams.defaultString.field_2._8_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4f8,"This is a test program.",&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_530,"This goes after the options.",
             (allocator *)
             ((long)&help.super_Flag.super_FlagBase.matcher.longFlags._M_h._M_single_bucket + 7));
  args::ArgumentParser::ArgumentParser((ArgumentParser *)local_4d8,&local_4f8,&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&help.super_Flag.super_FlagBase.matcher.longFlags._M_h._M_single_bucket + 7));
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_668,"help",&local_669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_690,"Display this help menu",&local_691);
  completion.syntax.field_2._8_8_ = &local_768;
  args::EitherFlag::EitherFlag((EitherFlag *)completion.syntax.field_2._8_8_,'h');
  completion.syntax.field_2._8_8_ = &local_740;
  args::EitherFlag::EitherFlag((EitherFlag *)completion.syntax.field_2._8_8_,"help");
  local_718 = &local_768;
  local_710._0_8_ = 2;
  in_00._M_len = 2;
  in_00._M_array = local_718;
  args::Matcher::Matcher((Matcher *)(local_710 + 8),in_00);
  args::HelpFlag::HelpFlag
            ((HelpFlag *)local_648,(Group *)local_4d8,&local_668,&local_690,
             (Matcher *)(local_710 + 8),None);
  args::Matcher::~Matcher((Matcher *)(local_710 + 8));
  local_9b8 = (EitherFlag *)&local_718;
  do {
    local_9b8 = local_9b8 + -1;
    args::EitherFlag::~EitherFlag(local_9b8);
  } while (local_9b8 != &local_768);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  args::EitherFlag::EitherFlag(&local_968,"complete");
  local_940 = &local_968;
  local_938._0_8_ = 1;
  in._M_len = 1;
  in._M_array = local_940;
  args::Matcher::Matcher((Matcher *)(local_938 + 8),in);
  args::CompletionFlag::CompletionFlag<args::ArgumentParser>
            ((CompletionFlag *)local_8c0,(ArgumentParser *)local_4d8,(Matcher *)(local_938 + 8));
  args::Matcher::~Matcher((Matcher *)(local_938 + 8));
  local_9d0 = (EitherFlag *)&local_940;
  do {
    local_9d0 = local_9d0 + -1;
    args::EitherFlag::~EitherFlag(local_9d0);
  } while (local_9d0 != &local_968);
  args::ArgumentParser::ParseCLI
            ((ArgumentParser *)local_4d8,argc,(char **)parser.helpParams.defaultString.field_2._8_8_
            );
  args::CompletionFlag::~CompletionFlag((CompletionFlag *)local_8c0);
  args::HelpFlag::~HelpFlag((HelpFlag *)local_648);
  args::ArgumentParser::~ArgumentParser((ArgumentParser *)local_4d8);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    args::ArgumentParser parser("This is a test program.", "This goes after the options.");
    args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
    args::CompletionFlag completion(parser, {"complete"});
    try
    {
        parser.ParseCLI(argc, argv);
    }
    catch (args::Completion& e)
    {
        std::cout << e.what();
        return 0;
    }
    catch (args::Help&)
    {
        std::cout << parser;
        return 0;
    }
    catch (args::ParseError& e)
    {
        std::cerr << e.what() << std::endl;
        std::cerr << parser;
        return 1;
    }
    return 0;
}